

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * calculateFiller(QString *__return_storage_ptr__,qsizetype padding,char32_t fillChar,
                         qsizetype fieldWidth,QLocaleData *localeData)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QString local_38;
  char32_t local_1c;
  QString *local_18;
  
  local_18 = *(QString **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (fillChar == L'0') {
    localeString(&local_38,(QLocaleData *)fieldWidth,ZeroDigit,
                 (DataRange)
                 ((ulong)*(byte *)(fieldWidth + 0x58) << 0x20 |
                 (ulong)*(ushort *)(fieldWidth + 0x16)));
  }
  else {
    qVar3 = 1;
    if (0xffff < (uint)fillChar) {
      fillChar = (fillChar & 0x3ffU) * 0x10000 + (((uint)fillChar >> 10) + 0xd7c0 & 0xffff) +
                 L'\xdc000000';
      qVar3 = 2;
    }
    local_1c = fillChar;
    QString::QString(&local_38,(QChar *)&local_1c,qVar3);
  }
  pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
  pcVar2 = (__return_storage_ptr__->d).ptr;
  (__return_storage_ptr__->d).d = local_38.d.d;
  (__return_storage_ptr__->d).ptr = local_38.d.ptr;
  qVar3 = (__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = local_38.d.size;
  local_38.d.d = (Data *)pQVar1;
  local_38.d.ptr = pcVar2;
  local_38.d.size = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  if (1 < padding) {
    QString::repeated(&local_38,__return_storage_ptr__,padding);
    pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_38.d.d;
    (__return_storage_ptr__->d).ptr = local_38.d.ptr;
    qVar3 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_38.d.size;
    local_38.d.d = (Data *)pQVar1;
    local_38.d.ptr = pcVar2;
    local_38.d.size = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_18) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QString calculateFiller(qsizetype padding,
                               char32_t fillChar,
                               [[maybe_unused]] qsizetype fieldWidth,
                               const QLocaleData *localeData)
{
    QString filler;
    if (fillChar == U'0') {
        Q_ASSERT(fieldWidth < 0);
        filler = localeData->zeroDigit();
    } else {
        filler = QString(QChar::fromUcs4(fillChar));
    }
    // ### size is not width
    if (padding > 1)
        filler = filler.repeated(padding);
    return filler;
}